

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O1

void __thiscall t_d_generator::generate_service(t_d_generator *this,t_service *tservice)

{
  string *__lhs;
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  t_service *ptVar4;
  t_struct *ptVar5;
  t_function *ptVar6;
  t_const_value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  int iVar7;
  undefined4 extraout_var;
  long *plVar8;
  ostream *poVar9;
  undefined4 extraout_var_00;
  undefined8 *puVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 uVar12;
  undefined4 extraout_var_01;
  long *plVar13;
  size_type *psVar14;
  bool bVar15;
  pointer pptVar16;
  char *pcVar17;
  pointer pptVar18;
  set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> exception_types;
  string meta_str;
  string f_skeletonname;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string f_servicename;
  ofstream_with_content_based_conditional_update f_skeleton;
  string svc_name;
  ostringstream meta;
  ofstream_with_content_based_conditional_update f_service;
  allocator local_60d;
  uint local_60c;
  undefined1 local_608 [32];
  _Rb_tree_node_base *local_5e8;
  size_t local_5e0;
  string local_5d8;
  pointer local_5b8;
  string local_5b0;
  vector<t_function_*,_std::allocator<t_function_*>_> local_590;
  char *local_578;
  long local_570;
  char local_568 [16];
  long *local_558;
  long local_550;
  long local_548;
  long lStack_540;
  undefined1 local_538 [112];
  string local_4c8 [32];
  undefined1 local_4a8;
  ios_base local_4a0 [264];
  t_service *local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  string local_388;
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 local_348 [376];
  undefined1 local_1d0 [144];
  undefined1 local_140;
  ios_base local_138 [264];
  
  iVar7 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  suffix_if_reserved(&local_388,(string *)CONCAT44(extraout_var,iVar7));
  __lhs = &this->package_dir_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 __lhs,&local_388);
  plVar8 = (long *)std::__cxx11::string::append(local_1d0);
  local_558 = &local_548;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_548 = *plVar13;
    lStack_540 = plVar8[3];
  }
  else {
    local_548 = *plVar13;
    local_558 = (long *)*plVar8;
  }
  local_550 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)local_538,(char *)local_558,(allocator *)local_348);
  std::__cxx11::string::_M_assign((string *)(local_1d0 + 0x70));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  pcVar17 = local_538 + 0x10;
  if ((char *)local_538._0_8_ != pcVar17) {
    operator_delete((void *)local_538._0_8_);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_538,this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_538._0_8_,local_538._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"module ",7);
  render_package_abi_cxx11_
            ((string *)local_608,this,(this->super_t_oop_generator).super_t_generator.program_);
  suffix_if_reserved((string *)local_348,(string *)local_608);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_348._0_8_,local_348._8_8_);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pcVar3 = local_348 + 0x10;
  local_390 = __lhs;
  if ((char *)local_348._0_8_ != pcVar3) {
    operator_delete((void *)local_348._0_8_);
  }
  pcVar2 = local_608 + 0x10;
  if ((char *)local_608._0_8_ != pcVar2) {
    operator_delete((void *)local_608._0_8_);
  }
  if ((char *)local_538._0_8_ != pcVar17) {
    operator_delete((void *)local_538._0_8_);
  }
  print_default_imports(this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"import ",7);
  render_package_abi_cxx11_
            ((string *)local_348,this,(this->super_t_oop_generator).super_t_generator.program_);
  suffix_if_reserved((string *)local_538,(string *)local_348);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_538._0_8_,local_538._8_8_);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types;",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((char *)local_538._0_8_ != pcVar17) {
    operator_delete((void *)local_538._0_8_);
  }
  if ((char *)local_348._0_8_ != pcVar3) {
    operator_delete((void *)local_348._0_8_);
  }
  ptVar4 = tservice->extends_;
  if (ptVar4 != (t_service *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"import ",7);
    render_package_abi_cxx11_((string *)local_348,this,(ptVar4->super_t_type).program_);
    suffix_if_reserved((string *)local_538,(string *)local_348);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,(char *)local_538._0_8_,local_538._8_8_);
    iVar7 = (*(ptVar4->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar4);
    suffix_if_reserved((string *)local_608,(string *)CONCAT44(extraout_var_00,iVar7));
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_608._0_8_,CONCAT44(local_608._12_4_,local_608._8_4_));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((char *)local_608._0_8_ != pcVar2) {
      operator_delete((void *)local_608._0_8_);
    }
    if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
      operator_delete((void *)local_538._0_8_);
    }
    if ((char *)local_348._0_8_ != pcVar3) {
      operator_delete((void *)local_348._0_8_);
    }
  }
  pcVar17 = local_538 + 0x10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  local_578 = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"");
  if (tservice->extends_ != (t_service *)0x0) {
    render_type_name_abi_cxx11_((string *)local_608,this,&tservice->extends_->super_t_type,false);
    suffix_if_reserved((string *)local_348,(string *)local_608);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0x399727);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar14) {
      local_538._16_8_ = *psVar14;
      local_538._24_8_ = plVar8[3];
      local_538._0_8_ = pcVar17;
    }
    else {
      local_538._16_8_ = *psVar14;
      local_538._0_8_ = (size_type *)*plVar8;
    }
    local_538._8_8_ = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_578,(string *)local_538);
    if ((char *)local_538._0_8_ != pcVar17) {
      operator_delete((void *)local_538._0_8_);
    }
    if ((char *)local_348._0_8_ != pcVar3) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((char *)local_608._0_8_ != pcVar2) {
      operator_delete((void *)local_608._0_8_);
    }
  }
  emit_doc(this,(t_doc *)tservice,(ostream *)local_1d0);
  t_generator::indent_abi_cxx11_((string *)local_538,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_538._0_8_,local_538._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"interface ",10);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_388._M_dataplus._M_p,local_388._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_578,local_570);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((char *)local_538._0_8_ != pcVar17) {
    operator_delete((void *)local_538._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_608._24_8_ = local_608 + 8;
  local_608._8_4_ = _S_red;
  local_608._16_8_ = 0;
  local_5e0 = 0;
  local_5e8 = (_Rb_tree_node_base *)local_608._24_8_;
  local_398 = tservice;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_590,&tservice->functions_)
  ;
  if (local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar16 = local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      emit_doc(this,&(*pptVar16)->super_t_doc,(ostream *)local_1d0);
      t_generator::indent_abi_cxx11_((string *)local_538,(t_generator *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,(char *)local_538._0_8_,local_538._8_8_);
      if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
        operator_delete((void *)local_538._0_8_);
      }
      print_function_signature(this,(ostream *)local_1d0,*pptVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      ptVar5 = (*pptVar16)->xceptions_;
      for (pptVar18 = (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar18 !=
          (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar18 = pptVar18 + 1) {
        local_538._0_8_ = (*pptVar18)->type_;
        std::
        _Rb_tree<t_type*,t_type*,std::_Identity<t_type*>,std::less<t_type*>,std::allocator<t_type*>>
        ::_M_insert_unique<t_type*>
                  ((_Rb_tree<t_type*,t_type*,std::_Identity<t_type*>,std::less<t_type*>,std::allocator<t_type*>>
                    *)local_608,(t_type **)local_538);
      }
      pptVar16 = pptVar16 + 1;
    } while (pptVar16 !=
             local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_5e0 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  p_Var11 = (_Rb_tree_node_base *)local_608._24_8_;
  if ((_Rb_tree_node_base *)local_608._24_8_ != (_Rb_tree_node_base *)(local_608 + 8)) {
    do {
      poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"alias ",6);
      render_package_abi_cxx11_
                ((string *)local_538,this,*(t_program **)(*(long *)(p_Var11 + 1) + 0x60));
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_538._0_8_,local_538._8_8_);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,*(char **)(*(long *)(*(long *)(p_Var11 + 1) + 0x60) + 0x50),
                          *(long *)(*(long *)(*(long *)(p_Var11 + 1) + 0x60) + 0x58));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
      puVar10 = (undefined8 *)(**(code **)(**(long **)(p_Var11 + 1) + 0x18))();
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)*puVar10,puVar10[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      puVar10 = (undefined8 *)(**(code **)(**(long **)(p_Var11 + 1) + 0x18))();
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)*puVar10,puVar10[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
        operator_delete((void *)local_538._0_8_);
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != (_Rb_tree_node_base *)(local_608 + 8));
  }
  uVar12 = std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_60c = (uint)CONCAT71((int7)((ulong)uVar12 >> 8),1);
    pptVar16 = local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      ptVar6 = *pptVar16;
      if ((((ptVar6->arglist_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (ptVar6->arglist_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) ||
          ((ptVar6->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (ptVar6->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
           _M_impl.super__Vector_impl_data._M_finish)) || (ptVar6->oneway_ != false)) {
        if ((local_60c & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,",",1);
        }
        else {
          local_60c = 0;
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_348,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)local_538,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)local_538._0_8_,local_538._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"TMethodMeta(`",0xd);
        suffix_if_reserved(&local_5d8,&(*pptVar16)->name_);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_5d8._M_dataplus._M_p,local_5d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`, ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p);
        }
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[",1);
        ptVar5 = (*pptVar16)->arglist_;
        pptVar18 = (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_5b8 = pptVar16;
        if (pptVar18 !=
            (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          bVar15 = true;
          do {
            if (bVar15) {
              bVar15 = false;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,", ",2);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_348,"TParamMeta(`",0xc);
            suffix_if_reserved((string *)local_538,&(*pptVar18)->name_);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_348,(char *)local_538._0_8_,local_538._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`, ",3);
            std::ostream::operator<<(poVar9,(*pptVar18)->key_);
            if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
              operator_delete((void *)local_538._0_8_);
            }
            value = (*pptVar18)->value_;
            if (value != (t_const_value *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,", q{",4);
              render_const_value_abi_cxx11_((string *)local_538,this,(*pptVar18)->type_,value);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_348,(char *)local_538._0_8_,local_538._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
              if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
                operator_delete((void *)local_538._0_8_);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,")",1);
            pptVar18 = pptVar18 + 1;
          } while (pptVar18 !=
                   (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"]",1);
        pptVar16 = local_5b8;
        ptVar5 = (*local_5b8)->xceptions_;
        if (((ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish) || ((*local_5b8)->oneway_ == true)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,",",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_348,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)local_538,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_538._0_8_,local_538._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[",1);
          if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
            operator_delete((void *)local_538._0_8_);
          }
          ptVar5 = (*pptVar16)->xceptions_;
          pptVar18 = (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (pptVar18 !=
              (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar15 = true;
            do {
              if (bVar15) {
                bVar15 = false;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,", ",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_348,"TExceptionMeta(`",0x10);
              suffix_if_reserved((string *)local_538,&(*pptVar18)->name_);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_348,(char *)local_538._0_8_,local_538._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`, ",3);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,(*pptVar18)->key_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", `",3);
              iVar7 = (*((*pptVar18)->type_->super_t_doc)._vptr_t_doc[3])();
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,*(char **)CONCAT44(extraout_var_01,iVar7),
                                  ((undefined8 *)CONCAT44(extraout_var_01,iVar7))[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`)",2);
              if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
                operator_delete((void *)local_538._0_8_);
              }
              pptVar18 = pptVar18 + 1;
            } while (pptVar18 !=
                     (ptVar5->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"]",1);
        }
        pptVar16 = local_5b8;
        if ((*local_5b8)->oneway_ == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,",",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_348,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)local_538,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_538._0_8_,local_538._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"TMethodType.ONEWAY",0x12);
          if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
            operator_delete((void *)local_538._0_8_);
          }
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_348,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)local_538,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)local_538._0_8_,local_538._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_);
        }
      }
      pptVar16 = pptVar16 + 1;
    } while (pptVar16 !=
             local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  __lhs_00 = local_390;
  ptVar4 = local_398;
  if (local_5d8._M_string_length != 0) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_((string *)local_538,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_538._0_8_,local_538._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"enum methodMeta = [",0x13);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_5d8._M_dataplus._M_p,local_5d8._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_5b0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
      operator_delete((void *)local_538._0_8_);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,
                 __lhs_00,&local_388);
  plVar8 = (long *)std::__cxx11::string::append(local_538);
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_5b0.field_2._M_allocated_capacity = *psVar14;
    local_5b0.field_2._8_8_ = plVar8[3];
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *psVar14;
    local_5b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_5b0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
    operator_delete((void *)local_538._0_8_);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_538);
  std::__cxx11::string::string((string *)local_368,local_5b0._M_dataplus._M_p,&local_60d);
  std::__cxx11::string::_M_assign(local_4c8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_538);
  local_4a8 = 0;
  if (local_368[0] != local_358) {
    operator_delete(local_368[0]);
  }
  poVar9 = (ostream *)local_538;
  print_server_skeleton(this,poVar9,ptVar4);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_538,(int)poVar9);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_538,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base((ios_base *)(local_348 + 0x70));
  if (local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_590.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<t_type_*,_t_type_*,_std::_Identity<t_type_*>,_std::less<t_type_*>,_std::allocator<t_type_*>_>
  ::~_Rb_tree((_Rb_tree<t_type_*,_t_type_*,_std::_Identity<t_type_*>,_std::less<t_type_*>,_std::allocator<t_type_*>_>
               *)local_608);
  if (local_578 != local_568) {
    operator_delete(local_578);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_558 != &local_548) {
    operator_delete(local_558);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  return;
}

Assistant:

void generate_service(t_service* tservice) override {
    string svc_name = suffix_if_reserved(tservice->get_name());

    // Service implementation file includes
    string f_servicename = package_dir_ + svc_name + ".d";
    ofstream_with_content_based_conditional_update f_service;
    f_service.open(f_servicename.c_str());
    f_service << autogen_comment() << "module " << suffix_if_reserved(render_package(*program_)) << svc_name << ";"
              << endl << endl;

    print_default_imports(f_service);

    f_service << "import " << suffix_if_reserved(render_package(*get_program())) << program_name_ << "_types;" << endl;

    t_service* extends_service = tservice->get_extends();
    if (extends_service != nullptr) {
      f_service << "import " << suffix_if_reserved(render_package(*(extends_service->get_program())))
                << suffix_if_reserved(extends_service->get_name()) << ";" << endl;
    }

    f_service << endl;

    string extends = "";
    if (tservice->get_extends() != nullptr) {
      extends = " : " + suffix_if_reserved(render_type_name(tservice->get_extends()));
    }

    this->emit_doc(tservice, f_service);
    f_service << indent() << "interface " << svc_name << extends << " {" << endl;
    indent_up();

    // Collect all the exception types service methods can throw so we can
    // emit the necessary aliases later.
    set<t_type*> exception_types;

    // Print the method signatures.
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator fn_iter;
    for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
      this->emit_doc(*fn_iter, f_service);
      f_service << indent();
      print_function_signature(f_service, *fn_iter);
      f_service << ";" << endl;

      const vector<t_field*>& exceptions = (*fn_iter)->get_xceptions()->get_members();
      vector<t_field*>::const_iterator ex_iter;
      for (ex_iter = exceptions.begin(); ex_iter != exceptions.end(); ++ex_iter) {
        exception_types.insert((*ex_iter)->get_type());
      }
    }

    // Alias the exception types into the current scope.
    if (!exception_types.empty())
      f_service << endl;
    set<t_type*>::const_iterator et_iter;
    for (et_iter = exception_types.begin(); et_iter != exception_types.end(); ++et_iter) {
      indent(f_service) << "alias " << render_package(*(*et_iter)->get_program())
                        << (*et_iter)->get_program()->get_name() << "_types"
                        << "." << (*et_iter)->get_name() << " " << (*et_iter)->get_name() << ";"
                        << endl;
    }

    // Write the method metadata.
    ostringstream meta;
    indent_up();
    bool first = true;
    for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
      if ((*fn_iter)->get_arglist()->get_members().empty()
          && (*fn_iter)->get_xceptions()->get_members().empty() && !(*fn_iter)->is_oneway()) {
        continue;
      }

      if (first) {
        first = false;
      } else {
        meta << ",";
      }

      meta << endl << indent() << "TMethodMeta(`" << suffix_if_reserved((*fn_iter)->get_name()) << "`, " << endl;
      indent_up();
      indent(meta) << "[";

      bool first = true;
      const vector<t_field*>& params = (*fn_iter)->get_arglist()->get_members();
      vector<t_field*>::const_iterator p_iter;
      for (p_iter = params.begin(); p_iter != params.end(); ++p_iter) {
        if (first) {
          first = false;
        } else {
          meta << ", ";
        }

        meta << "TParamMeta(`" << suffix_if_reserved((*p_iter)->get_name()) << "`, " << (*p_iter)->get_key();

        t_const_value* cv = (*p_iter)->get_value();
        if (cv != nullptr) {
          meta << ", q{" << render_const_value((*p_iter)->get_type(), cv) << "}";
        }
        meta << ")";
      }

      meta << "]";

      if (!(*fn_iter)->get_xceptions()->get_members().empty() || (*fn_iter)->is_oneway()) {
        meta << "," << endl << indent() << "[";

        bool first = true;
        const vector<t_field*>& exceptions = (*fn_iter)->get_xceptions()->get_members();
        vector<t_field*>::const_iterator ex_iter;
        for (ex_iter = exceptions.begin(); ex_iter != exceptions.end(); ++ex_iter) {
          if (first) {
            first = false;
          } else {
            meta << ", ";
          }

          meta << "TExceptionMeta(`" << suffix_if_reserved((*ex_iter)->get_name()) << "`, "
               << (*ex_iter)->get_key() << ", `" << (*ex_iter)->get_type()->get_name() << "`)";
        }

        meta << "]";
      }

      if ((*fn_iter)->is_oneway()) {
        meta << "," << endl << indent() << "TMethodType.ONEWAY";
      }

      indent_down();
      meta << endl << indent() << ")";
    }
    indent_down();

    string meta_str(meta.str());
    if (!meta_str.empty()) {
      f_service << endl << indent() << "enum methodMeta = [" << meta_str << endl << indent() << "];"
                << endl;
    }

    indent_down();
    indent(f_service) << "}" << endl;

    // Server skeleton generation.
    string f_skeletonname = package_dir_ + svc_name + "_server.skeleton.d";
    ofstream_with_content_based_conditional_update f_skeleton;
    f_skeleton.open(f_skeletonname.c_str());
    print_server_skeleton(f_skeleton, tservice);
    f_skeleton.close();
  }